

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O2

Real __thiscall
amrex::MultiFab::norm0(MultiFab *this,iMultiFab *mask,int comp,int nghost,bool local)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  Real local_168;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<const_int> local_d0;
  MFIter mfi;
  
  MFIter::MFIter(&mfi,(FabArrayBase *)this,true);
  local_168 = 0.0;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::growntilebox(&local_12c,&mfi,nghost);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_110,&this->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              (&local_d0,&mask->super_FabArray<amrex::IArrayBox>,&mfi);
    lVar1 = (long)local_12c.smallend.vect[0];
    lVar6 = (long)local_12c.smallend.vect[1];
    lVar3 = (long)local_12c.smallend.vect[2];
    lVar5 = (lVar6 - local_d0.begin.y) * local_d0.jstride * 4 +
            (lVar3 - local_d0.begin.z) * local_d0.kstride * 4 + lVar1 * 4 +
            (long)local_d0.begin.x * -4 + (long)local_d0.p;
    lVar9 = local_110.nstride * (long)comp * 8 +
            (lVar6 - local_110.begin.y) * local_110.jstride * 8 +
            (lVar3 - local_110.begin.z) * local_110.kstride * 8 + lVar1 * 8 +
            (long)local_110.begin.x * -8 + (long)local_110.p;
    for (; lVar2 = lVar6, lVar4 = lVar9, lVar7 = lVar5, lVar3 <= local_12c.bigend.vect[2];
        lVar3 = lVar3 + 1) {
      for (; lVar2 <= local_12c.bigend.vect[1]; lVar2 = lVar2 + 1) {
        for (lVar8 = 0; lVar1 + lVar8 <= (long)local_12c.bigend.vect[0]; lVar8 = lVar8 + 1) {
          dVar10 = local_168;
          if ((*(int *)(lVar7 + lVar8 * 4) != 0) &&
             (dVar10 = ABS(*(double *)(lVar4 + lVar8 * 8)), dVar10 <= local_168)) {
            dVar10 = local_168;
          }
          local_168 = dVar10;
        }
        lVar4 = lVar4 + local_110.jstride * 8;
        lVar7 = lVar7 + local_d0.jstride * 4;
      }
      lVar5 = lVar5 + local_d0.kstride * 4;
      lVar9 = lVar9 + local_110.kstride * 8;
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return local_168;
}

Assistant:

Real
MultiFab::norm0 (const iMultiFab& mask, int comp, int nghost, bool local) const
{
    BL_PROFILE("MultiFab::norm0(mask)");

    Real nm0 = Real(0.0);

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& ma = this->const_arrays();
        auto const& maskma = mask.const_arrays();
        nm0 = ParReduce(TypeList<ReduceOpMax>{}, TypeList<Real>{}, *this, IntVect(nghost),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
        {
            if (maskma[box_no](i,j,k)) {
                return amrex::Math::abs(ma[box_no](i,j,k,comp));
            } else {
                return Real(0.0);
            }
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:nm0)
#endif
        for (MFIter mfi(*this,true); mfi.isValid(); ++mfi) {
            Box const& bx = mfi.growntilebox(nghost);
            auto const& a = this->const_array(mfi);
            auto const& mskfab = mask.const_array(mfi);
            AMREX_LOOP_3D(bx, i, j, k,
            {
                if (mskfab(i,j,k)) {
                    nm0 = std::max(nm0, amrex::Math::abs(a(i,j,k,comp)));
                }
            });
        }
    }

    if (!local) {
        ParallelAllReduce::Max(nm0, ParallelContext::CommunicatorSub());
    }

    return nm0;
}